

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnNoise3_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise,int *status)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int in_ECX;
  size_t in_RDX;
  size_t in_RSI;
  long in_RDI;
  long *in_R8;
  float *in_R9;
  float in_XMM0_Da;
  float fVar4;
  float *in_stack_00000008;
  double *in_stack_00000010;
  double xnoise;
  double *diffs;
  int do_range;
  float xmaxval;
  float xminval;
  float v5;
  float v4;
  float v3;
  float v2;
  float v1;
  float *rowpix;
  float *differences;
  long ngoodpix;
  long nvals;
  long nrows;
  long jj;
  long ii;
  double local_a0;
  double *local_98;
  float local_8c;
  float local_88;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float *local_68;
  long local_60;
  long local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  size_t local_20;
  size_t local_18;
  
  local_50 = 0;
  local_60 = 0;
  local_88 = 3.4028235e+38;
  local_8c = -3.4028235e+38;
  bVar2 = false;
  local_a0 = 0.0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((long)in_RSI < 5) {
    local_18 = in_RSI * in_RDX;
    local_20 = 1;
  }
  if ((long)local_18 < 5) {
    for (local_40 = 0; (long)local_40 < (long)local_18; local_40 = local_40 + 1) {
      if (((in_ECX == 0) || (fVar4 = *(float *)(in_RDI + local_40 * 4), fVar4 != in_XMM0_Da)) ||
         (NAN(fVar4) || NAN(in_XMM0_Da))) {
        if (*(float *)(in_RDI + local_40 * 4) < local_88) {
          local_88 = *(float *)(in_RDI + local_40 * 4);
        }
        if (local_8c < *(float *)(in_RDI + local_40 * 4)) {
          local_8c = *(float *)(in_RDI + local_40 * 4);
        }
        local_60 = local_60 + 1;
      }
    }
    if (in_R9 != (float *)0x0) {
      *in_R9 = local_88;
    }
    if (in_stack_00000008 != (float *)0x0) {
      *in_stack_00000008 = local_8c;
    }
    if (in_R8 != (long *)0x0) {
      *in_R8 = local_60;
    }
    if (in_stack_00000010 != (double *)0x0) {
      *in_stack_00000010 = 0.0;
    }
    return *(int *)xnoise;
  }
  if ((in_R9 != (float *)0x0) || (in_stack_00000008 != (float *)0x0)) {
    bVar2 = true;
  }
  if (in_stack_00000010 != (double *)0x0) {
    local_68 = (float *)calloc(local_18,4);
    if (local_68 == (float *)0x0) {
      *(undefined4 *)xnoise = 0x71;
      return *(int *)xnoise;
    }
    local_98 = (double *)calloc(local_20,8);
    if (local_98 == (double *)0x0) {
      free(local_68);
      *(undefined4 *)xnoise = 0x71;
      return *(int *)xnoise;
    }
  }
  local_48 = 0;
  do {
    if ((long)local_20 <= local_48) {
      if (in_stack_00000010 != (double *)0x0) {
        if (local_50 == 0) {
          local_a0 = 0.0;
        }
        else if (local_50 == 1) {
          local_a0 = *local_98;
        }
        else {
          qsort(local_98,local_50,8,FnCompare_double);
          local_a0 = (local_98[(long)(local_50 - 1) / 2] + local_98[(long)local_50 / 2]) / 2.0;
        }
      }
      if (in_R8 != (long *)0x0) {
        *in_R8 = local_60;
      }
      if (in_R9 != (float *)0x0) {
        *in_R9 = local_88;
      }
      if (in_stack_00000008 != (float *)0x0) {
        *in_stack_00000008 = local_8c;
      }
      if (in_stack_00000010 != (double *)0x0) {
        *in_stack_00000010 = local_a0 * 0.6052697;
        free(local_98);
        free(local_68);
      }
      return *(int *)xnoise;
    }
    lVar3 = in_RDI + local_48 * local_18 * 4;
    local_40 = 0;
    if (in_ECX != 0) {
      while( true ) {
        bVar1 = false;
        if ((long)local_40 < (long)local_18) {
          bVar1 = *(float *)(lVar3 + local_40 * 4) == in_XMM0_Da;
        }
        if (!bVar1) break;
        local_40 = local_40 + 1;
      }
    }
    if (local_40 != local_18) {
      local_74 = *(float *)(lVar3 + local_40 * 4);
      if (bVar2) {
        if (local_74 < local_88) {
          local_88 = local_74;
        }
        if (local_8c < local_74) {
          local_8c = local_74;
        }
      }
      local_40 = local_40 + 1;
      if (in_ECX != 0) {
        while( true ) {
          bVar1 = false;
          if ((long)local_40 < (long)local_18) {
            bVar1 = *(float *)(lVar3 + local_40 * 4) == in_XMM0_Da;
          }
          if (!bVar1) break;
          local_40 = local_40 + 1;
        }
      }
      if (local_40 != local_18) {
        local_78 = *(float *)(lVar3 + local_40 * 4);
        if (bVar2) {
          if (local_78 < local_88) {
            local_88 = local_78;
          }
          if (local_8c < local_78) {
            local_8c = local_78;
          }
        }
        local_40 = local_40 + 1;
        if (in_ECX != 0) {
          while( true ) {
            bVar1 = false;
            if ((long)local_40 < (long)local_18) {
              bVar1 = *(float *)(lVar3 + local_40 * 4) == in_XMM0_Da;
            }
            if (!bVar1) break;
            local_40 = local_40 + 1;
          }
        }
        if (local_40 != local_18) {
          local_7c = *(float *)(lVar3 + local_40 * 4);
          if (bVar2) {
            if (local_7c < local_88) {
              local_88 = local_7c;
            }
            if (local_8c < local_7c) {
              local_8c = local_7c;
            }
          }
          local_40 = local_40 + 1;
          if (in_ECX != 0) {
            while( true ) {
              bVar1 = false;
              if ((long)local_40 < (long)local_18) {
                bVar1 = *(float *)(lVar3 + local_40 * 4) == in_XMM0_Da;
              }
              if (!bVar1) break;
              local_40 = local_40 + 1;
            }
          }
          if (local_40 != local_18) {
            local_80 = *(float *)(lVar3 + local_40 * 4);
            if (bVar2) {
              if (local_80 < local_88) {
                local_88 = local_80;
              }
              if (local_8c < local_80) {
                local_8c = local_80;
              }
            }
            local_58 = 0;
            while (local_40 = local_40 + 1, (long)local_40 < (long)local_18) {
              if (in_ECX != 0) {
                while( true ) {
                  bVar1 = false;
                  if ((long)local_40 < (long)local_18) {
                    bVar1 = *(float *)(lVar3 + local_40 * 4) == in_XMM0_Da;
                  }
                  if (!bVar1) break;
                  local_40 = local_40 + 1;
                }
              }
              if (local_40 == local_18) break;
              fVar4 = *(float *)(lVar3 + local_40 * 4);
              if (bVar2) {
                if (fVar4 < local_88) {
                  local_88 = fVar4;
                }
                if (local_8c < fVar4) {
                  local_8c = fVar4;
                }
              }
              if (in_stack_00000010 == (double *)0x0) {
                local_60 = local_60 + 1;
              }
              else if (((local_74 != local_78) || (local_78 != local_7c)) ||
                      ((local_7c != local_80 ||
                       ((local_80 != fVar4 || (NAN(local_80) || NAN(fVar4))))))) {
                local_68[local_58] =
                     (float)(double)((ulong)(((double)local_7c + (double)local_7c +
                                             -(double)local_74) - (double)fVar4) &
                                    (ulong)DAT_0026e000);
                local_58 = local_58 + 1;
              }
              else {
                local_60 = local_60 + 1;
              }
              local_74 = local_78;
              local_78 = local_7c;
              local_7c = local_80;
              local_80 = fVar4;
            }
            local_60 = local_58 + 4 + local_60;
            if (in_stack_00000010 != (double *)0x0) {
              if (local_58 == 0) goto LAB_0024705c;
              if (local_58 == 1) {
                local_98[local_50] = (double)*local_68;
              }
              else {
                fVar4 = quick_select_float(local_68,(int)local_58);
                local_98[local_50] = (double)fVar4;
              }
            }
            local_50 = local_50 + 1;
          }
        }
      }
    }
LAB_0024705c:
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

static int FnNoise3_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise,      /* returned R.M.S. value of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 3rd order differences.

The noise in the background of the image is calculated using the 3rd order algorithm 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nvals, ngoodpix = 0;
	float *differences, *rowpix, v1, v2, v3, v4, v5;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs, xnoise = 0;

	if (nx < 5) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 5 pixels to calc noise, so just calc min, max, ngood */
	if (nx < 5) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise) *noise = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	if (noise) {
	    differences = calloc(nx, sizeof(float));
	    if (!differences) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	    }

	    diffs = calloc(ny, sizeof(double));
	    if (!diffs) {
		free(differences);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	    }
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
		
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) {
			  ii++;
		        }
			
		    if (ii == nx) break;  /* hit end of row */
		    v5 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		    }

		    /* construct array of 3rd order absolute differences */
		    if (noise) {
		        if (!(v1 == v2 && v2 == v3 && v3 == v4 && v4 == v5)) {

		            differences[nvals] = (float) fabs((2. * v3) - v1 - v5);
		            nvals++;  
		       } else {
		            /* ignore constant background regions */
			    ngoodpix++;
		       }
		    } else {
		       /* just increment the number of non-null pixels */
		       ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
	        }  /* end of loop over pixels in the row */

		/* compute the 3rd order diffs */
		/* Note that there are 4 more pixel values than there are diffs values. */
		ngoodpix += (nvals + 4);

		if (noise) {
		    if (nvals == 0) {
		        continue;  /* cannot compute medians on this row */
		    } else if (nvals == 1) {
		        diffs[nrows] = differences[0];
		    } else {
                        /* quick_select returns the median MUCH faster than using qsort */
                        diffs[nrows] = quick_select_float(differences, nvals);
		    }
		}
		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (noise) {
	    if (nrows == 0) { 
	       xnoise = 0;
	    } else if (nrows == 1) {
	       xnoise = diffs[0];
	    } else {	    
	       qsort(diffs, nrows, sizeof(double), FnCompare_double);
	       xnoise =  (diffs[(nrows - 1)/2] + diffs[nrows/2]) / 2.;
	    }
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise) {
		*noise  = 0.6052697 * xnoise;
		free(diffs);
		free(differences);
	}

	return(*status);
}